

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Indexer.cpp
# Opt level: O0

vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> * __thiscall
Indexer::finalize(Indexer *this)

{
  bool bVar1;
  vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *in_RDI;
  Indexer *in_stack_00000028;
  DatasetBuilder *in_stack_00000288;
  Indexer *in_stack_00000290;
  
  bVar1 = DatasetBuilder::empty((DatasetBuilder *)0x172d0d);
  if (!bVar1) {
    make_spill(in_stack_00000290,in_stack_00000288);
  }
  bVar1 = DatasetBuilder::empty((DatasetBuilder *)0x172d30);
  if (!bVar1) {
    make_spill(in_stack_00000290,in_stack_00000288);
  }
  created_dataset_ptrs(in_stack_00000028);
  return in_RDI;
}

Assistant:

std::vector<const OnDiskDataset *> Indexer::finalize() {
    if (!flat_builder.empty()) {
        make_spill(flat_builder);
    }

    if (!bitmap_builder.empty()) {
        make_spill(bitmap_builder);
    }

    return created_dataset_ptrs();
}